

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_listener_set_security_descriptor(nng_listener id,void *cfg)

{
  nni_listener *local_28;
  nni_listener *l;
  void *pvStack_18;
  int rv;
  void *cfg_local;
  nng_listener id_local;
  
  pvStack_18 = cfg;
  cfg_local._0_4_ = id.id;
  l._4_4_ = nni_listener_find(&local_28,id.id);
  cfg_local._4_4_ = l._4_4_;
  if (l._4_4_ == 0) {
    l._4_4_ = nni_listener_set_security_descriptor(local_28,pvStack_18);
    nni_listener_rele(local_28);
    cfg_local._4_4_ = l._4_4_;
  }
  return cfg_local._4_4_;
}

Assistant:

int
nng_listener_set_security_descriptor(nng_listener id, void *cfg)
{
	int           rv;
	nni_listener *l;
	if ((rv = nni_listener_find(&l, id.id)) != 0) {
		return (rv);
	}
	rv = nni_listener_set_security_descriptor(l, cfg);
	nni_listener_rele(l);
	return (rv);
}